

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_gc(lua_State *L,int what,int data)

{
  uint64_t uVar1;
  int iVar2;
  long local_48;
  long local_40;
  GCSize a;
  int res;
  global_State *g;
  int data_local;
  int what_local;
  lua_State *L_local;
  
  uVar1 = (L->glref).ptr64;
  a._4_4_ = 0;
  switch(what) {
  case 0:
    *(undefined8 *)(uVar1 + 0x18) = 0x800000000000;
    break;
  case 1:
    if (data == -1) {
      local_40 = (*(ulong *)(uVar1 + 0x10) / 100) * (ulong)*(uint *)(uVar1 + 0x6c);
    }
    else {
      local_40 = *(long *)(uVar1 + 0x10);
    }
    *(long *)(uVar1 + 0x18) = local_40;
    break;
  case 2:
    lj_gc_fullgc(L);
    break;
  case 3:
    a._4_4_ = (uint)(*(ulong *)(uVar1 + 0x10) >> 10);
    break;
  case 4:
    a._4_4_ = (uint)*(undefined8 *)(uVar1 + 0x10) & 0x3ff;
    break;
  case 5:
    if (*(ulong *)(uVar1 + 0x10) < (ulong)((long)data * 0x400)) {
      local_48 = 0;
    }
    else {
      local_48 = *(long *)(uVar1 + 0x10) + (long)data * -0x400;
    }
    *(long *)(uVar1 + 0x18) = local_48;
    do {
      if (*(ulong *)(uVar1 + 0x10) < *(ulong *)(uVar1 + 0x18)) {
        return 0;
      }
      iVar2 = lj_gc_step(L);
    } while (iVar2 < 1);
    a._4_4_ = 1;
    break;
  case 6:
    a._4_4_ = *(uint *)(uVar1 + 0x6c);
    *(int *)(uVar1 + 0x6c) = data;
    break;
  case 7:
    a._4_4_ = *(uint *)(uVar1 + 0x68);
    *(int *)(uVar1 + 0x68) = data;
    break;
  default:
    a._4_4_ = 0xffffffff;
    break;
  case 9:
    a._4_4_ = (uint)(*(long *)(uVar1 + 0x18) != 0x800000000000);
  }
  return a._4_4_;
}

Assistant:

LUA_API int lua_gc(lua_State *L, int what, int data)
{
  global_State *g = G(L);
  int res = 0;
  switch (what) {
  case LUA_GCSTOP:
    g->gc.threshold = LJ_MAX_MEM;
    break;
  case LUA_GCRESTART:
    g->gc.threshold = data == -1 ? (g->gc.total/100)*g->gc.pause : g->gc.total;
    break;
  case LUA_GCCOLLECT:
    lj_gc_fullgc(L);
    break;
  case LUA_GCCOUNT:
    res = (int)(g->gc.total >> 10);
    break;
  case LUA_GCCOUNTB:
    res = (int)(g->gc.total & 0x3ff);
    break;
  case LUA_GCSTEP: {
    GCSize a = (GCSize)data << 10;
    g->gc.threshold = (a <= g->gc.total) ? (g->gc.total - a) : 0;
    while (g->gc.total >= g->gc.threshold)
      if (lj_gc_step(L) > 0) {
	res = 1;
	break;
      }
    break;
  }
  case LUA_GCSETPAUSE:
    res = (int)(g->gc.pause);
    g->gc.pause = (MSize)data;
    break;
  case LUA_GCSETSTEPMUL:
    res = (int)(g->gc.stepmul);
    g->gc.stepmul = (MSize)data;
    break;
  case LUA_GCISRUNNING:
    res = (g->gc.threshold != LJ_MAX_MEM);
    break;
  default:
    res = -1;  /* Invalid option. */
  }
  return res;
}